

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O0

void avro::schema::testBasic(char *schema)

{
  basic_wrap_stringstream<char> *this;
  char **in_stack_fffffffffffffdf8;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffe00;
  std_string *s;
  basic_wrap_stringstream<char> *this_00;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffe20;
  const_string *in_stack_fffffffffffffe38;
  _func_int **in_stack_fffffffffffffe40;
  const_string *in_stack_fffffffffffffe48;
  unit_test_log_t *in_stack_fffffffffffffe50;
  basic_cstring<const_char> local_18;
  
  s = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
             ,0x6e);
  this_00 = (basic_wrap_stringstream<char> *)&stack0xfffffffffffffe40;
  memset(this_00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffe00);
  boost::basic_wrap_stringstream<char>::ref(this_00);
  this = boost::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffffe20);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  avro::compileJsonSchemaFromString(&stack0xfffffffffffffe20);
  ValidSchema::~ValidSchema((ValidSchema *)0x2099c8);
  return;
}

Assistant:

static void testBasic(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    compileJsonSchemaFromString(schema);
}